

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::TextFlow::Columns::iterator::iterator
          (iterator *this,
          vector<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_> *columns)

{
  pointer pCVar1;
  Column *col;
  pointer pCVar2;
  iterator local_50;
  
  this->m_columns = columns;
  (this->m_iterators).
  super__Vector_base<Catch::TextFlow::Column::iterator,_std::allocator<Catch::TextFlow::Column::iterator>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_iterators).
  super__Vector_base<Catch::TextFlow::Column::iterator,_std::allocator<Catch::TextFlow::Column::iterator>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_iterators).
  super__Vector_base<Catch::TextFlow::Column::iterator,_std::allocator<Catch::TextFlow::Column::iterator>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_activeIterators = 0;
  std::vector<Catch::TextFlow::Column::iterator,_std::allocator<Catch::TextFlow::Column::iterator>_>
  ::reserve(&this->m_iterators,
            ((long)(columns->
                   super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
            (long)(columns->
                  super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>
                  )._M_impl.super__Vector_impl_data._M_start) / 0x38);
  pCVar1 = (this->m_columns->
           super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (pCVar2 = (this->m_columns->
                super__Vector_base<Catch::TextFlow::Column,_std::allocator<Catch::TextFlow::Column>_>
                )._M_impl.super__Vector_impl_data._M_start; pCVar2 != pCVar1; pCVar2 = pCVar2 + 1) {
    local_50.m_pos = (pCVar2->m_string)._M_string_length;
    local_50.m_len = 0;
    local_50.m_end = 0;
    local_50.m_suffix = false;
    local_50.m_column = pCVar2;
    std::
    vector<Catch::TextFlow::Column::iterator,_std::allocator<Catch::TextFlow::Column::iterator>_>::
    emplace_back<Catch::TextFlow::Column::iterator>(&this->m_iterators,&local_50);
  }
  return;
}

Assistant:

Columns::iterator::iterator(Columns const &columns, EndTag) :
            m_columns(columns.m_columns), m_activeIterators(0) {

            m_iterators.reserve(m_columns.size());
            for (auto const &col : m_columns) {
                m_iterators.push_back(col.end());
            }
        }